

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

HeapAndPointer __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
          (void *this,Index bytes,Expression *ptr,Index offset)

{
  int shifts;
  Address offset_00;
  Ref ptr_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar1;
  ValueBuilder *this_00;
  size_t sVar2;
  IString name;
  HeapAndPointer HVar3;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  ptr_00 = makePointer(wasm::Expression*,wasm::Address_(this,ptr,offset_00);
  if (bytes == 4) {
    shifts = 2;
    this_00 = cashew::HEAP32;
    sVar2 = DAT_011753e0;
  }
  else {
    if (bytes != 2) {
      pcVar1 = extraout_RDX;
      this_00 = cashew::HEAP8;
      sVar2 = DAT_011753c0;
      if (bytes != 1) {
        handle_unreachable("unimp",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                           ,0x811);
      }
      goto LAB_00d3d2c9;
    }
    shifts = 1;
    this_00 = cashew::HEAP16;
    sVar2 = DAT_011753d0;
  }
  ptr_00 = cashew::ValueBuilder::makePtrShift(ptr_00,shifts);
  pcVar1 = extraout_RDX_00;
LAB_00d3d2c9:
  name.str._M_str = pcVar1;
  name.str._M_len = sVar2;
  HVar3.heap = cashew::ValueBuilder::makeName(this_00,name);
  HVar3.ptr.inst = ptr_00.inst;
  return HVar3;
}

Assistant:

HeapAndPointer
    getHeapAndAdjustedPointer(Index bytes, Expression* ptr, Index offset) {
      IString heap;
      Ref adjustedPtr = makePointer(ptr, offset);
      switch (bytes) {
        case 1:
          heap = HEAP8;
          break;
        case 2:
          heap = HEAP16;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 1);
          break;
        case 4:
          heap = HEAP32;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 2);
          break;
        default: {
          WASM_UNREACHABLE("unimp");
        }
      }
      return {ValueBuilder::makeName(heap), adjustedPtr};
    }